

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>
     *this,int i)

{
  Fad<double> *pFVar1;
  Fad<double> *pFVar2;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *pFVar4;
  double *pdVar5;
  double *pdVar6;
  value_type vVar7;
  
  vVar7 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>_>
          ::dx(&this->left_->fadexpr_,i);
  pFVar1 = (this->right_->fadexpr_).left_;
  pFVar2 = (this->right_->fadexpr_).right_;
  pdVar6 = &pFVar1->defaultVal;
  if ((pFVar1->dx_).num_elts != 0) {
    pdVar6 = (pFVar1->dx_).ptr_to_data + i;
  }
  pdVar5 = &pFVar2->defaultVal;
  if ((pFVar2->dx_).num_elts != 0) {
    pdVar5 = (pFVar2->dx_).ptr_to_data + i;
  }
  pFVar3 = (this->left_->fadexpr_).left_;
  pFVar4 = (this->left_->fadexpr_).right_;
  return vVar7 * (pFVar1->val_ - pFVar2->val_) +
         (((pFVar4->fadexpr_).left_)->val_ - ((pFVar4->fadexpr_).right_)->val_) *
         ((pFVar3->fadexpr_).left_)->val_ * ((pFVar3->fadexpr_).right_)->val_ * (*pdVar6 - *pdVar5);
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}